

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  Arena *pAVar1;
  MessageLite *this;
  Arena *pAVar2;
  char *failure_msg;
  int line;
  Arena *pAVar3;
  MessageLite *other;
  Arena *arena;
  MessageLite *this_00;
  Metadata MVar4;
  LogMessageFatal LStack_28;
  
  pAVar1 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar2 = pAVar1;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar3 = arena;
  if (((ulong)arena & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (pAVar2 == pAVar3) {
    failure_msg = "lhs->GetArena() != rhs->GetArena()";
    line = 0x1a6;
LAB_003a2b93:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
  }
  pAVar2 = pAVar1;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  if (pAVar2 == (Arena *)0x0) {
    pAVar2 = arena;
    if (((ulong)arena & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    if (pAVar2 == (Arena *)0x0) {
      failure_msg = "lhs->GetArena() != nullptr || rhs->GetArena() != nullptr";
      line = 0x1a7;
      goto LAB_003a2b93;
    }
  }
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  other = &lhs->super_MessageLite;
  this_00 = &rhs->super_MessageLite;
  if ((arena == (Arena *)0x0) &&
     (other = &rhs->super_MessageLite, arena = pAVar1, this_00 = &lhs->super_MessageLite,
     ((ulong)pAVar1 & 1) != 0)) {
    arena = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  this = MessageLite::New(this_00,arena);
  MessageLite::CheckTypeAndMergeFrom(this,other);
  (*other->_vptr_MessageLite[2])(other);
  MessageLite::CheckTypeAndMergeFrom(other,this_00);
  MVar4 = Message::GetMetadata((Message *)this_00);
  Reflection::Swap(MVar4.reflection,(Message *)this,(Message *)this_00);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
  if (!internal::DebugHardenForceCopyInSwap()) {
    ABSL_DCHECK(lhs->GetArena() != rhs->GetArena());
    ABSL_DCHECK(lhs->GetArena() != nullptr || rhs->GetArena() != nullptr);
  }
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = rhs->GetArena();
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = rhs->GetArena();
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
  if (internal::DebugHardenForceCopyInSwap()) {
    rhs->Clear();
    rhs->CheckTypeAndMergeFrom(*tmp);
    if (arena == nullptr) delete tmp;
  } else {
    rhs->GetReflection()->Swap(tmp, rhs);
  }
}